

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O1

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::addUser(SubgraphNode<dg::pta::PSNode> *this,PSNode *nd)

{
  pointer *pppPVar1;
  iterator __position;
  PSNode *pPVar2;
  PSNode **ppPVar3;
  bool bVar4;
  PSNode *local_8;
  
  ppPVar3 = (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = ppPVar3 == __position._M_current;
  if (!bVar4) {
    pPVar2 = *ppPVar3;
    while (pPVar2 != nd) {
      ppPVar3 = ppPVar3 + 1;
      bVar4 = ppPVar3 == __position._M_current;
      if (bVar4) goto LAB_0010fd3f;
      pPVar2 = *ppPVar3;
    }
    if (!bVar4) {
      return;
    }
  }
LAB_0010fd3f:
  if (__position._M_current ==
      (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = nd;
    std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
    _M_realloc_insert<dg::pta::PSNode*const&>
              ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&this->users,__position,
               &local_8);
  }
  else {
    *__position._M_current = nd;
    pppPVar1 = &(this->users).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return;
}

Assistant:

void addUser(NodeT *nd) {
        // do not add duplicate users
        for (auto *u : users)
            if (u == nd)
                return;

        users.push_back(nd);
    }